

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectBlur.cpp
# Opt level: O2

void __thiscall
Rml::FontEffectBlurInstancer::~FontEffectBlurInstancer(FontEffectBlurInstancer *this)

{
  ~FontEffectBlurInstancer(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

SharedPtr<FontEffect> FontEffectBlurInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	float width = properties.GetProperty(id_width)->Get<float>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	auto font_effect = MakeShared<FontEffectBlur>();
	if (font_effect->Initialise(int(width)))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}